

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

uint64_t __thiscall
capnp::compiler::Compiler::Impl::addNode(Impl *this,uint64_t desiredId,Node *node)

{
  Module *pMVar1;
  long lVar2;
  undefined8 *puVar3;
  uint64_t uVar4;
  char *pcVar5;
  char (*in_R8) [23];
  char (*params_2) [23];
  char (*pacVar6) [23];
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>,std::allocator<std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var7;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false,_false>,_bool>
  pVar8;
  String local_78;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>,std::allocator<std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_60;
  uint64_t local_58;
  undefined1 local_50 [32];
  
  p_Var7 = (_Hashtable<unsigned_long,std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>,std::allocator<std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            *)&this->nodesById;
  local_60 = p_Var7;
  do {
    local_50._0_8_ = desiredId;
    local_50._8_8_ = node;
    pVar8 = std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>,std::allocator<std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,capnp::compiler::Compiler::Node*>>(p_Var7,local_50)
    ;
    uVar4 = desiredId;
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if ((long)desiredId < 0) {
        kj::hex((CappedArray<char,_17UL> *)local_50,desiredId);
        kj::str<char_const(&)[17],kj::CappedArray<char,17ul>,char_const(&)[2]>
                  (&local_78,(kj *)"Duplicate ID @0x",(char (*) [17])local_50,
                   (CappedArray<char,_17UL> *)0x262a08,(char (*) [2])in_R8);
        pcVar5 = "";
        if ((char (*) [23])local_78.content.size_ != (char (*) [23])0x0) {
          pcVar5 = local_78.content.ptr;
        }
        params_2 = (char (*) [23])
                   ((char *)local_78.content.size_ +
                   ((char (*) [23])local_78.content.size_ == (char (*) [23])0x0));
        pMVar1 = node->module->parserModule;
        (**(pMVar1->super_ErrorReporter)._vptr_ErrorReporter)
                  (pMVar1,(ulong)node->startByte,(ulong)node->endByte,pcVar5);
        pacVar6 = (char (*) [23])local_78.content.size_;
        pcVar5 = local_78.content.ptr;
        if (local_78.content.ptr != (char *)0x0) {
          local_78.content.ptr = (char *)0x0;
          local_78.content.size_ = 0;
          (**(local_78.content.disposer)->_vptr_ArrayDisposer)
                    (local_78.content.disposer,pcVar5,1,pacVar6,pacVar6,0);
          params_2 = pacVar6;
        }
        lVar2 = *(long *)((long)pVar8.first.
                                super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                                ._M_cur.
                                super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                         + 0x10);
        kj::hex((CappedArray<char,_17UL> *)local_50,desiredId);
        kj::str<char_const(&)[7],kj::CappedArray<char,17ul>,char_const(&)[23]>
                  (&local_78,(kj *)0x26cf85,(char (*) [7])local_50,
                   (CappedArray<char,_17UL> *)" originally used here.",params_2);
        pcVar5 = "";
        if ((char (*) [23])local_78.content.size_ != (char (*) [23])0x0) {
          pcVar5 = local_78.content.ptr;
        }
        in_R8 = (char (*) [23])
                ((char *)local_78.content.size_ +
                ((char (*) [23])local_78.content.size_ == (char (*) [23])0x0));
        puVar3 = *(undefined8 **)(*(long *)(lVar2 + 8) + 8);
        (**(code **)*puVar3)
                  (puVar3,*(undefined4 *)(lVar2 + 0x6c),*(undefined4 *)(lVar2 + 0x70),pcVar5);
        p_Var7 = local_60;
        pacVar6 = (char (*) [23])local_78.content.size_;
        pcVar5 = local_78.content.ptr;
        if (local_78.content.ptr != (char *)0x0) {
          local_78.content.ptr = (char *)0x0;
          local_78.content.size_ = 0;
          (**(local_78.content.disposer)->_vptr_ArrayDisposer)(local_78.content.disposer,pcVar5,1);
          in_R8 = pacVar6;
        }
      }
      desiredId = this->nextBogusId;
      this->nextBogusId = desiredId + 1;
      uVar4 = local_58;
    }
    local_58 = uVar4;
  } while (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
  return local_58;
}

Assistant:

uint64_t Compiler::Impl::addNode(uint64_t desiredId, Node& node) {
  for (;;) {
    auto insertResult = nodesById.insert(std::make_pair(desiredId, &node));
    if (insertResult.second) {
      return desiredId;
    }

    // Only report an error if this ID is not bogus.  Actual IDs specified in the original source
    // code are required to have the upper bit set.  Anything else must have been manufactured
    // at some point to cover up an error.
    if (desiredId & (1ull << 63)) {
      node.addError(kj::str("Duplicate ID @0x", kj::hex(desiredId), "."));
      insertResult.first->second->addError(
          kj::str("ID @0x", kj::hex(desiredId), " originally used here."));
    }

    // Assign a new bogus ID.
    desiredId = nextBogusId++;
  }
}